

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O0

int testSingleEncodes(void)

{
  int iVar1;
  char local_c8 [8];
  char result [30];
  int local_9c;
  int i;
  anon_struct_32_4_0130f588 test_single_encode [4];
  int local_c;
  int nrTests;
  
  local_c = 0;
  memcpy(&stack0xffffffffffffff68,&DAT_002e7490,0x80);
  local_9c = 0;
  while (*(long *)&test_single_encode[local_9c].territory != 0) {
    encodeLatLonToSingleMapcode
              (local_c8,*(double *)(&stack0xffffffffffffff68 + (long)local_9c * 0x20),
               test_single_encode[local_9c].latDeg,
               *(Territory *)&test_single_encode[local_9c].lonDeg,4);
    iVar1 = strcmp(local_c8,*(char **)&test_single_encode[local_9c].territory);
    if (iVar1 != 0) {
      printf("*** ERROR *** encodeLatLonToSingleMapcode()=%s, expected %s\n",local_c8,
             *(undefined8 *)&test_single_encode[local_9c].territory);
    }
    local_c = local_c + 1;
    local_9c = local_9c + 1;
  }
  return local_c;
}

Assistant:

static int testSingleEncodes(void) {
    int nrTests = 0;
    struct {
        double latDeg;
        double lonDeg;
        enum Territory territory;
        const char *result;
    } test_single_encode[] = {
            {52.3, 4.9, TERRITORY_NLD, "NLD GG.LCG-RJQ4"},
            {50,   5,   TERRITORY_BEL, "BEL T71.5V7-N0PT"},
            {32,   5,   TERRITORY_DZA, "DZA CG4.G4F6-KJ00"},
            {0,    0,   TERRITORY_NONE, NULL}
    };
    int i;
    for (i = 0; test_single_encode[i].result != NULL; i++) {
        char result[MAX_MAPCODE_RESULT_ASCII_LEN + 1];
        encodeLatLonToSingleMapcode(result, test_single_encode[i].latDeg, test_single_encode[i].lonDeg,
                                    test_single_encode[i].territory, 4);
        if (strcmp(result, test_single_encode[i].result) != 0) {
            printf("*** ERROR *** encodeLatLonToSingleMapcode()=%s, expected %s\n",
                   result, test_single_encode[i].result);
        }
        nrTests++;
    }
    return nrTests;
}